

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O0

QSize qSmartMinSize(QWidget *w)

{
  long lVar1;
  QSizePolicy QVar2;
  QSize *sizeHint;
  QSize QVar3;
  QSize minSize;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)in_RDI + 0x70))();
  sizeHint = (QSize *)(**(code **)(*(long *)in_RDI + 0x78))();
  QVar3 = QWidget::minimumSize
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  minSize = QWidget::maximumSize
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  QVar2 = QWidget::sizePolicy(in_RDI);
  QVar3 = qSmartMinSize(sizeHint,(QSize *)QVar3,(QSize *)minSize,
                        (QSize *)CONCAT44(QVar2.field_0,in_stack_ffffffffffffffd0),
                        (QSizePolicy *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMinSize(const QWidget *w)
{
    return qSmartMinSize(w->sizeHint(), w->minimumSizeHint(),
                            w->minimumSize(), w->maximumSize(),
                            w->sizePolicy());
}